

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageBuilderLiteGenerator::MessageBuilderLiteGenerator
          (MessageBuilderLiteGenerator *this,Descriptor *descriptor,Context *context)

{
  _Rb_tree_header *p_Var1;
  ClassNameResolver *pCVar2;
  LogMessage *pLVar3;
  Descriptor *pDVar4;
  long lVar5;
  long lVar6;
  LogFinisher local_69;
  LogMessage local_68;
  
  this->_vptr_MessageBuilderLiteGenerator = (_func_int **)&PTR__MessageBuilderLiteGenerator_004d27b0
  ;
  this->descriptor_ = descriptor;
  this->context_ = context;
  pCVar2 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar2;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
  FieldGeneratorMap(&this->field_generators_,descriptor,this->context_);
  p_Var1 = &(this->oneofs_)._M_t._M_impl.super__Rb_tree_header;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((context->options_).enforce_lite == false) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message_builder_lite.cc"
               ,0x43);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: !HasDescriptorMethods(descriptor->file(), context->EnforceLite()): "
                       );
    pLVar3 = internal::LogMessage::operator<<
                       (pLVar3,
                        "Generator factory error: A lite message generator is used to generate non-lite messages."
                       );
    internal::LogFinisher::operator=(&local_69,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
  }
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 4)) {
    lVar6 = 0x28;
    lVar5 = 0;
    do {
      local_68._0_8_ = *(long *)(*(long *)(pDVar4 + 0x28) + lVar6);
      if ((local_68._0_8_ != 0 && (*(byte *)(*(long *)(pDVar4 + 0x28) + -0x27 + lVar6) & 0x10) != 0)
         && ((*(int *)(local_68._0_8_ + 4) != 1 ||
             ((*(byte *)(*(long *)(local_68._0_8_ + 0x20) + 1) & 2) == 0)))) {
        std::
        _Rb_tree<google::protobuf::OneofDescriptor_const*,google::protobuf::OneofDescriptor_const*,std::_Identity<google::protobuf::OneofDescriptor_const*>,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<google::protobuf::OneofDescriptor_const*>>
        ::_M_insert_unique<google::protobuf::OneofDescriptor_const*>
                  ((_Rb_tree<google::protobuf::OneofDescriptor_const*,google::protobuf::OneofDescriptor_const*,std::_Identity<google::protobuf::OneofDescriptor_const*>,std::less<google::protobuf::OneofDescriptor_const*>,std::allocator<google::protobuf::OneofDescriptor_const*>>
                    *)&this->oneofs_,(OneofDescriptor **)&local_68);
        pDVar4 = this->descriptor_;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x48;
    } while (lVar5 < *(int *)(pDVar4 + 4));
  }
  return;
}

Assistant:

MessageBuilderLiteGenerator::MessageBuilderLiteGenerator(
    const Descriptor* descriptor, Context* context)
    : descriptor_(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()),
      field_generators_(descriptor, context_) {
  GOOGLE_CHECK(!HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A lite message generator is used to "
         "generate non-lite messages.";
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (IsRealOneof(descriptor_->field(i))) {
      oneofs_.insert(descriptor_->field(i)->containing_oneof());
    }
  }
}